

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_abstracttx_controller.cpp
# Opt level: O3

void __thiscall
AbstractTransactionController_EnableLockTimeTest_Test::
~AbstractTransactionController_EnableLockTimeTest_Test
          (AbstractTransactionController_EnableLockTimeTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(AbstractTransactionController, EnableLockTimeTest) {
  const std::string expect_tx_hex = "02000000000090000000";
  const uint32_t lock_time = 144;
  TestTransactionController txc = TestTransactionController(lock_time);
  EXPECT_STREQ(txc.GetHex().c_str(), expect_tx_hex.c_str());
  EXPECT_EQ(txc.GetDefaultSequence(), expect_absttx_enablelt_sequence_num);
  EXPECT_EQ(txc.GetLockTimeDisabledSequence(),
      expect_absttx_default_sequence_num);
}